

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O0

double __thiscall
ON_SubDSectorType::GetSubdominantEigenvectors
          (ON_SubDSectorType *this,double *E1,size_t E1_capacity,double *E2,size_t E2_capacity)

{
  ON_SubDVertexTag OVar1;
  uint uVar2;
  uint local_b4;
  double local_b0;
  uint local_94;
  uint local_90;
  uint i_3;
  uint i_2;
  uint I;
  uint M;
  uint sector_angle_index;
  uint i_1;
  uint i;
  double sin1;
  double sin0;
  double cos1;
  double cos0;
  double y;
  uint F;
  uint R;
  double lambda;
  double rc_error;
  size_t E2_capacity_local;
  double *E2_local;
  size_t E1_capacity_local;
  double *E1_local;
  ON_SubDSectorType *this_local;
  
  lambda = -1.23432101234321e+308;
  rc_error = (double)E2_capacity;
  E2_capacity_local = (size_t)E2;
  E2_local = (double *)E1_capacity;
  E1_capacity_local = (size_t)E1;
  E1_local = (double *)this;
  _F = SubdominantEigenvalue(this);
  if ((_F <= 0.0) || (1.0 <= _F)) {
    ON_SubDIncrementErrorCount();
  }
  else {
    y._4_4_ = PointRingCount(this);
    if (y._4_4_ < 3) {
      ON_SubDIncrementErrorCount();
    }
    else {
      y._0_4_ = FaceCount(this);
      if (y._0_4_ == 0) {
        ON_SubDIncrementErrorCount();
      }
      else {
        if (E2_local == (double *)0x0) {
          E1_capacity_local = 0;
        }
        else if ((E2_local < (double *)(ulong)y._4_4_) || (E1_capacity_local == 0)) {
          ON_SubDIncrementErrorCount();
          return -1.23432101234321e+308;
        }
        if (rc_error == 0.0) {
          E2_capacity_local = 0;
        }
        else if (((ulong)rc_error < (ulong)y._4_4_) || (E2_capacity_local == 0)) {
          ON_SubDIncrementErrorCount();
          return -1.23432101234321e+308;
        }
        if (((E1_capacity_local == 0) || (E2_capacity_local == 0)) &&
           ((E1_capacity_local != 0 || (E2_capacity_local != 0)))) {
          ON_SubDIncrementErrorCount();
        }
        else {
          OVar1 = VertexTag(this);
          switch(OVar1) {
          case Unset:
            break;
          case Smooth:
            if ((y._4_4_ & 1) == 1) {
              if (E1_capacity_local != 0) {
                cos1 = 1.0;
                sin1 = 0.0;
                ON_SubDMatrix::EvaluateCosAndSin(2,y._0_4_,&sin0,(double *)&i_1);
                if ((_F != 0.25) || (NAN(_F))) {
                  local_b0 = ((_F * 4.0 + -1.0) * 2.0) / (sin0 + 1.0) - 1.0;
                }
                else {
                  local_b0 = -1.0;
                }
                cos0 = local_b0;
                *(undefined8 *)E1_capacity_local = 0;
                *(undefined8 *)E2_capacity_local = 0;
                *(double *)(E1_capacity_local + 8) = sin1;
                *(double *)(E2_capacity_local + 8) = cos1;
                sector_angle_index = 2;
                while( true ) {
                  *(double *)(E1_capacity_local + (ulong)sector_angle_index * 8) =
                       cos0 * (sin1 + _i_1);
                  *(double *)(E2_capacity_local + (ulong)sector_angle_index * 8) =
                       cos0 * (cos1 + sin0);
                  uVar2 = sector_angle_index + 1;
                  if (uVar2 == y._4_4_) break;
                  *(double *)(E1_capacity_local + (ulong)uVar2 * 8) = _i_1;
                  *(double *)(E2_capacity_local + (ulong)uVar2 * 8) = sin0;
                  sector_angle_index = sector_angle_index + 2;
                  cos1 = sin0;
                  sin1 = _i_1;
                  ON_SubDMatrix::EvaluateCosAndSin(sector_angle_index,y._0_4_,&sin0,(double *)&i_1);
                }
              }
              return _F;
            }
            break;
          case Crease:
            if ((y._4_4_ & 1) == 0) {
              if (y._0_4_ == 1) {
                *(undefined8 *)E1_capacity_local = 0;
                *(undefined8 *)(E1_capacity_local + 8) = 0x3ff0000000000000;
                *(undefined8 *)(E1_capacity_local + 0x10) = 0;
                *(undefined8 *)(E1_capacity_local + 0x18) = 0xbff0000000000000;
                *(undefined8 *)E2_capacity_local = 0x3ff0000000000000;
                *(undefined8 *)(E2_capacity_local + 8) = 0xc000000000000000;
                *(undefined8 *)(E2_capacity_local + 0x10) = 0xc014000000000000;
                *(undefined8 *)(E2_capacity_local + 0x18) = 0xc000000000000000;
              }
              else {
                sin0 = 1.0;
                _i_1 = 0.0;
                *(undefined8 *)E1_capacity_local = 0;
                *(undefined8 *)E2_capacity_local = 0;
                local_94 = 1;
                do {
                  cos1 = sin0;
                  sin1 = _i_1;
                  ON_SubDMatrix::EvaluateCosAndSin((local_94 >> 1) + 1,y._0_4_,&sin0,(double *)&i_1)
                  ;
                  *(double *)(E1_capacity_local + (ulong)local_94 * 8) = sin1;
                  *(double *)(E2_capacity_local + (ulong)local_94 * 8) = cos1;
                  *(double *)(E1_capacity_local + (ulong)(local_94 + 1) * 8) = sin1 + _i_1;
                  *(double *)(E2_capacity_local + (ulong)(local_94 + 1) * 8) = cos1 + sin0;
                  local_94 = local_94 + 2;
                } while (y._4_4_ - 1 != local_94);
                *(double *)(E1_capacity_local + (ulong)local_94 * 8) = _i_1;
                *(double *)(E2_capacity_local + (ulong)local_94 * 8) = sin0;
              }
              return _F;
            }
            break;
          case Corner:
            if ((y._4_4_ & 1) == 0) {
              local_b4 = CornerSectorAngleIndex(this);
              if (0x48 < local_b4 << 1) {
                local_b4 = 0x48 - local_b4;
              }
              sin0 = 1.0;
              _i_1 = 0.0;
              *(undefined8 *)E1_capacity_local = 0;
              *(undefined8 *)E2_capacity_local = 0;
              local_90 = 1;
              do {
                cos1 = sin0;
                sin1 = _i_1;
                ON_SubDMatrix::EvaluateCosAndSin
                          (((local_90 >> 1) + 1) * local_b4 * 2,y._0_4_ * 0x48,&sin0,(double *)&i_1)
                ;
                *(double *)(E1_capacity_local + (ulong)local_90 * 8) = sin1;
                *(double *)(E2_capacity_local + (ulong)local_90 * 8) = cos1;
                *(double *)(E1_capacity_local + (ulong)(local_90 + 1) * 8) = sin1 + _i_1;
                *(double *)(E2_capacity_local + (ulong)(local_90 + 1) * 8) = cos1 + sin0;
                local_90 = local_90 + 2;
              } while (y._4_4_ - 1 != local_90);
              *(double *)(E1_capacity_local + (ulong)local_90 * 8) = _i_1;
              *(double *)(E2_capacity_local + (ulong)local_90 * 8) = sin0;
              return _F;
            }
            break;
          case Dart:
            if ((y._4_4_ & 1) == 1) {
              if (E1_capacity_local != 0) {
                cos1 = 1.0;
                sin1 = 0.0;
                ON_SubDMatrix::EvaluateCosAndSin(2,y._0_4_,&sin0,(double *)&i_1);
                *(undefined8 *)E1_capacity_local = 0;
                *(undefined8 *)E2_capacity_local = 0;
                *(double *)(E1_capacity_local + 8) = sin1;
                *(double *)(E2_capacity_local + 8) = cos1;
                M = 2;
                while( true ) {
                  *(double *)(E1_capacity_local + (ulong)M * 8) = sin1 + _i_1;
                  *(double *)(E2_capacity_local + (ulong)M * 8) = cos1 + sin0;
                  uVar2 = M + 1;
                  if (uVar2 == y._4_4_) break;
                  *(double *)(E1_capacity_local + (ulong)uVar2 * 8) = _i_1;
                  *(double *)(E2_capacity_local + (ulong)uVar2 * 8) = sin0;
                  M = M + 2;
                  cos1 = sin0;
                  sin1 = _i_1;
                  ON_SubDMatrix::EvaluateCosAndSin(M,y._0_4_,&sin0,(double *)&i_1);
                }
              }
              return _F;
            }
          }
          ON_SubDIncrementErrorCount();
        }
      }
    }
  }
  return -1.23432101234321e+308;
}

Assistant:

double ON_SubDSectorType::GetSubdominantEigenvectors(
  double* E1,
  size_t E1_capacity,
  double* E2,
  size_t E2_capacity
) const
{
  const double rc_error = ON_UNSET_VALUE;
  const double lambda = SubdominantEigenvalue();
  if (!(lambda > 0.0 && lambda < 1.0))
    return ON_SUBD_RETURN_ERROR(rc_error);

  const unsigned int R = PointRingCount();
  if (R < 3)
    return ON_SUBD_RETURN_ERROR(rc_error);

  const unsigned int F = FaceCount();
  if (F < 1)
    return ON_SUBD_RETURN_ERROR(rc_error);

  if ( 0 == E1_capacity)
    E1 = nullptr;
  else if (E1_capacity < R || nullptr == E1)
  {
    return ON_SUBD_RETURN_ERROR(rc_error);
  }

  if ( 0 == E2_capacity)
    E2 = nullptr;
  else if (E2_capacity < R || nullptr == E2)
  {
    return ON_SUBD_RETURN_ERROR(rc_error);
  }

  if (nullptr == E1 || nullptr == E2)
  {
    // If one of LT0ev or E2 is null, then both must be null.
    if (nullptr != E1 || nullptr != E2)
    {
      return ON_SUBD_RETURN_ERROR(rc_error);
    }
  }

  double y, cos0, cos1, sin0, sin1;

  switch (VertexTag())
  {
  case ON_SubDVertexTag::Unset:
    break;

  case ON_SubDVertexTag::Smooth:
    if (1 == (R % 2))
    {
      if (nullptr != E1)
      {
        // cos0 = cos(2pi * 0/F)
        // sin0 = sin(2pi * 0/F)
        // cos1 = cos(2pi * 1/F)
        // sin1 = sin(2pi * 1/F)
        cos0 = 1.0;
        sin0 = 0.0;
        ON_SubDMatrix::EvaluateCosAndSin(2, F, &cos1, &sin1);
        //y = 0.5*(3.0 * sqrt((1.0 + cos1 / 9.0) / (1.0 + cos1)) - 1.0);
        y = (0.25 == lambda) ? -1.0 : (2.0*(4.0*lambda - 1.0) / (1.0 + cos1) - 1.0);
        E1[0] = 0.0;
        E2[0] = 0.0;
        E1[1] = sin0;
        E2[1] = cos0;
        unsigned int i = 2;
        for (;;)
        {
          E1[i] = y*(sin0 + sin1);
          E2[i] = y*(cos0 + cos1);
          i++;
          if (i==R)
            break;
          E1[i] = sin1;
          E2[i] = cos1;
          i++;
          cos0 = cos1;
          sin0 = sin1;
          ON_SubDMatrix::EvaluateCosAndSin(i, F, &cos1, &sin1);
          // E1[] and E2[] values are symmetric and we could stop halfway and copy
          // current loop debugged and tested Feb 10, 2015
        }
      }
      return lambda;
    }
    break;

  case ON_SubDVertexTag::Dart:
    if (1 == (R % 2))
    {
      if (nullptr != E1)
      {
        // cos0 = cos(2pi * 0/F)
        // sin0 = sin(2pi * 0/F)
        // cos1 = cos(2pi * 1/F)
        // sin1 = sin(2pi * 1/F)
        cos0 = 1.0;
        sin0 = 0.0;
        ON_SubDMatrix::EvaluateCosAndSin(2, F, &cos1, &sin1);
        E1[0] = 0.0;
        E2[0] = 0.0;
        E1[1] = sin0;
        E2[1] = cos0;
        unsigned int i = 2;
        for (;;)
        {
          E1[i] = sin0 + sin1;
          E2[i] = cos0 + cos1;
          i++;
          if (i==R)
            break;
          E1[i] = sin1;
          E2[i] = cos1;
          i++;
          cos0 = cos1;
          sin0 = sin1;
          ON_SubDMatrix::EvaluateCosAndSin(i, F, &cos1, &sin1);
          // E1[] and E2[] values are symmetric and we could stop halfway and copy
          // current loop debugged and tested Feb 10, 2015
        }
      }
      return lambda;
    }
    break;

  case ON_SubDVertexTag::Corner:
    if (0 == (R % 2))
    {
      const unsigned int sector_angle_index = CornerSectorAngleIndex();
      const unsigned int M = ON_SubDSectorType::MaximumCornerAngleIndex;
      //const unsigned int I = ((2*sector_angle_index <= M) ? sector_angle_index : (M-sector_angle_index));
      const unsigned int I = 2*((2*sector_angle_index <= M) ? sector_angle_index : (M-sector_angle_index));
      // F faces, F-1 interior smooth edges and 2 boundary edges
      // theta = (i/M*2pi)/F
      cos1 = 1.0; // = cos(0)
      sin1 = 0.0; // = sin(0)
      E1[0] = 0.0;
      E2[0] = 0.0;
      unsigned int i = 1;
      for (;;)
      {
        cos0 = cos1;
        sin0 = sin1;
        ON_SubDMatrix::EvaluateCosAndSin((i/2 + 1)*I,F*M,&cos1,&sin1);
        E1[i] = sin0;
        E2[i] = cos0;
        i++;
        E1[i] = sin0+sin1;
        E2[i] = cos0+cos1;
        i++;
        if (R - 1 == i)
        {
          E1[i] = sin1; // = sin(pi)
          E2[i] = cos1; // = cos(pi)
          break;
        }
      }
      return lambda;
    }
    break;

  case ON_SubDVertexTag::Crease:
    if (0 == (R % 2))
    {
      if (1 == F)
      {
        // one face and 2 boundary edges
        // E1 = eigenvector with eigenvalue = 1/2
        E1[0] =  0.0; // center point coefficients
        E1[1] =  1.0; // initial boundary edge point coefficient
        E1[2] =  0.0; // face point coefficient
        E1[3] = -1.0; // final boundary edge point coefficient


        // (0,0,1,0) = eigenvector with eigenvalue = 1/4.
        // E2 is not an eigenvector
        // S * E2 = (1/4, 1/4, 2/5, 1/4)
        E2[0] =  1.0; // center point coefficients
        E2[1] = -2.0; // boundary edge point coefficient
        E2[2] = -5.0; // face point coefficient
        E2[3] = -2.0; // boundary edge point coefficient
      }
      else
      {
        // F faces, F-1 interior smooth edges and 2 boundary edges
        // theta = pi/F
        cos1 = 1.0; // = cos(0)
        sin1 = 0.0; // = sin(0)
        E1[0] = 0.0;
        E2[0] = 0.0;
        unsigned int i = 1;
        for (;;)
        {
          cos0 = cos1;
          sin0 = sin1;
          ON_SubDMatrix::EvaluateCosAndSin(i/2 + 1,F,&cos1,&sin1);
          E1[i] = sin0;
          E2[i] = cos0;
          i++;
          E1[i] = sin0+sin1;
          E2[i] = cos0+cos1;
          i++;
          if (R - 1 == i)
          {
            E1[i] = sin1; // = sin(pi)
            E2[i] = cos1; // = cos(pi)
            break;
          }
        }
      }

      return lambda;
    }
    break;
  }

  return ON_SUBD_RETURN_ERROR(rc_error);
}